

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

FileInfoCacheKey * __thiscall MakefileGenerator::fileInfo(MakefileGenerator *this,QString *file)

{
  bool bVar1;
  int iVar2;
  FileInfoCacheKey *this_00;
  ulong uVar3;
  FileInfoCacheKey *in_RDX;
  FileInfoCacheKey *in_RDI;
  long in_FS_OFFSET;
  QFileInfo *fi;
  QFileInfo value;
  FileInfoCacheKey cacheKey;
  FileInfoCacheKey *in_stack_ffffffffffffff68;
  FileInfoCacheKey *key;
  QHash<FileInfoCacheKey,_QFileInfo> *in_stack_ffffffffffffff88;
  undefined8 local_48;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  if ((fileInfo(QString)::noInfo == '\0') &&
     (iVar2 = __cxa_guard_acquire(&fileInfo(QString)::noInfo), iVar2 != 0)) {
    QFileInfo::QFileInfo((QFileInfo *)&fileInfo(QString)::noInfo);
    __cxa_atexit(QFileInfo::~QFileInfo,&fileInfo(QString)::noInfo,&__dso_handle);
    __cxa_guard_release(&fileInfo(QString)::noInfo);
  }
  if (fileInfo::cache == (QHash<FileInfoCacheKey,_QFileInfo> *)0x0) {
    this_00 = (FileInfoCacheKey *)operator_new(8);
    QHash<FileInfoCacheKey,_QFileInfo>::QHash((QHash<FileInfoCacheKey,_QFileInfo> *)this_00);
    fileInfo::cache = (QHash<FileInfoCacheKey,_QFileInfo> *)this_00;
    in_stack_ffffffffffffff68 = (FileInfoCacheKey *)fileInfo::cache;
    qmakeAddCacheClear((qmakeCacheClearFunc)in_RDX,&fileInfo::cache->d);
  }
  memset(local_40,0xaa,0x38);
  FileInfoCacheKey::FileInfoCacheKey(in_RDX,(QString *)in_stack_ffffffffffffff68);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  QHash<FileInfoCacheKey,_QFileInfo>::value(in_stack_ffffffffffffff88,key,(QFileInfo *)in_RDI);
  bVar1 = ::operator!=((QFileInfo *)in_RDX,(QFileInfo *)in_stack_ffffffffffffff68);
  if (bVar1) {
    QFileInfo::QFileInfo((QFileInfo *)in_RDI,(QFileInfo *)&local_48);
  }
  else {
    in_RDI->hash = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)in_RDI,(QString *)in_RDX);
    uVar3 = QFileInfo::exists();
    if ((uVar3 & 1) != 0) {
      QHash<FileInfoCacheKey,_QFileInfo>::insert
                ((QHash<FileInfoCacheKey,_QFileInfo> *)in_RDX,in_stack_ffffffffffffff68,
                 (QFileInfo *)0x175e47);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_48);
  FileInfoCacheKey::~FileInfoCacheKey(in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return key;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo
MakefileGenerator::fileInfo(QString file) const
{
    Q_CONSTINIT static QHash<FileInfoCacheKey, QFileInfo> *cache = nullptr;
    static QFileInfo noInfo = QFileInfo();
    if(!cache) {
        cache = new QHash<FileInfoCacheKey, QFileInfo>;
        qmakeAddCacheClear(qmakeDeleteCacheClear<QHash<FileInfoCacheKey, QFileInfo> >, (void**)&cache);
    }
    FileInfoCacheKey cacheKey(file);
    QFileInfo value = cache->value(cacheKey, noInfo);
    if (value != noInfo)
        return value;

    QFileInfo fi(file);
    if (fi.exists())
        cache->insert(cacheKey, fi);
    return fi;
}